

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O3

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::step_four(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
            *this)

{
  ulong *puVar1;
  pointer pVVar2;
  pointer pAVar3;
  pointer piVar4;
  pointer pIVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  AdjacencyIterator it;
  pointer pAVar9;
  Step SVar10;
  pointer pAVar11;
  difference_type __d;
  ulong uVar12;
  IndexPair local_30;
  
  local_30 = find_zero(this,0);
  SVar10 = SIX;
  if (local_30.col != 0xffffffffffffffff && local_30.row != 0xffffffffffffffff) {
    do {
      uVar7 = local_30.row;
      pVVar2 = (this->graph_->vertices_).
               super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar9 = *(pointer *)&((Adjacencies *)((long)(pVVar2 + uVar7) + 0x20))->vector_;
      pAVar3 = *(pointer *)((long)(pVVar2 + uVar7) + 0x28);
      pAVar11 = pAVar9;
      uVar12 = (long)pAVar3 - (long)pAVar9 >> 4;
      while (uVar8 = uVar12, 0 < (long)uVar8) {
        uVar12 = uVar8 >> 1;
        if (pAVar11[uVar12].vertex_ < local_30.col) {
          pAVar11 = pAVar11 + uVar12 + 1;
          uVar12 = ~uVar12 + uVar8;
        }
      }
      if ((pAVar3 == pAVar11) || (pAVar11->vertex_ != local_30.col)) {
        uVar12 = 0;
      }
      else {
        uVar12 = pAVar11->edge_;
      }
      piVar4 = (this->mask_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar4[uVar12] = 2;
      pAVar11 = pAVar9;
      while( true ) {
        if (pAVar11 == pAVar3) {
          pIVar5 = (this->path_).
                   super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((this->path_).
              super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
              ._M_impl.super__Vector_impl_data._M_finish != pIVar5) {
            (this->path_).
            super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
            ._M_impl.super__Vector_impl_data._M_finish = pIVar5;
          }
          std::
          vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair,std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair>>
          ::emplace_back<unsigned_long&,unsigned_long&>
                    ((vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair,std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair>>
                      *)&this->path_,&local_30.row,&local_30.col);
          SVar10 = FIVE;
          goto LAB_00138bb6;
        }
        if (piVar4[pAVar11->edge_] == 1) break;
        pAVar11 = pAVar11 + 1;
      }
      do {
        if (piVar4[pAVar9->edge_] == 1) {
          uVar12 = pAVar9->vertex_;
          goto LAB_00138ae3;
        }
        pAVar9 = pAVar9 + 1;
      } while (pAVar9 != pAVar3);
      uVar12 = 0xffffffffffffffff;
LAB_00138ae3:
      uVar8 = uVar7 + 0x3f;
      if (-1 < (long)uVar7) {
        uVar8 = uVar7;
      }
      puVar1 = (this->row_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
               ((long)uVar8 >> 6) +
               (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
      *puVar1 = *puVar1 | 1L << ((byte)local_30.row & 0x3f);
      uVar12 = uVar12 - ((long)(this->rows_).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->rows_).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3);
      uVar8 = uVar12 + 0x3f;
      if (-1 < (long)uVar12) {
        uVar8 = uVar12;
      }
      bVar6 = (byte)uVar12 & 0x3f;
      puVar1 = (this->col_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
               ((long)uVar8 >> 6) +
               (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
      *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      local_30 = find_zero(this,uVar7 + 1);
    } while ((local_30.row != 0xffffffffffffffff) && (local_30.col != 0xffffffffffffffff));
  }
LAB_00138bb6:
  this->step_ = SVar10;
  return;
}

Assistant:

void
Matching<GRAPH, COST, MASK>::step_four()
{
    IndexPair idx;
    Index start_row{ 0 };
    while (true) {

        idx = find_zero(start_row);

        if (idx.row == IDXMAX || idx.col == IDXMAX) {
            // No zero found.
            step_ = Step::SIX;
            return;
        }

        // it is more likely to find another zero
        // _after_ the last location, so we pass it
        // as a hint to find_zero.
        start_row = idx.row + 1;

        // prime at given index.
        mask_[graph_.findEdge(idx.row, idx.col).second] = PRIMED;

        if (has_star_in_row(idx.row)) {
            const auto col = find_star_in_row(idx.row);
            row_cover[idx.row] = true;
            col_cover[col_of_idx(col)] = false;
        } else {
            // starting point for augmenting path.
            path_.clear();
            path_.emplace_back(idx.row, idx.col);
            step_ = Step::FIVE;
            return;
        }
    }
}